

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cShaderAtomicCountersTests.cpp
# Opt level: O2

long __thiscall glcts::NegativeArray::Run(NegativeArray *this)

{
  bool bVar1;
  GLuint GVar2;
  long lVar3;
  allocator<char> local_31;
  string local_30;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,
             "\nlayout(local_size_x = 8, local_size_y = 8, local_size_z = 1) in;\nlayout(binding = 0) uniform atomic_uint ac_counter[3];\nlayout(std430) buffer Output {\n  mediump uint data_inc[256];\n} g_out;\nvoid main() {\n  mediump uint offset = 32u * gl_GlobalInvocationID.y + gl_GlobalInvocationID.x;\n  g_out.data_inc[offset] = atomicCounterIncrement(ac_counter);\n}"
             ,&local_31);
  GVar2 = BasicUsageCS::CreateComputeProgram(&this->super_BasicUsageCS,&local_30);
  *(GLuint *)&(this->super_BasicUsageCS).field_0x34 = GVar2;
  std::__cxx11::string::~string((string *)&local_30);
  glu::CallLogWrapper::glLinkProgram
            (&(this->super_BasicUsageCS).super_SACSubcaseBase.super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,*(GLuint *)&(this->super_BasicUsageCS).field_0x34);
  lVar3 = 0;
  bVar1 = BasicUsageCS::CheckProgram
                    (&this->super_BasicUsageCS,*(GLuint *)&(this->super_BasicUsageCS).field_0x34,
                     (bool *)0x0);
  if (bVar1) {
    glcts::anon_unknown_0::Output
              (
              "Link should fail because atomicCounterIncrement cannot be used on array of atomic counters.\n"
              );
    lVar3 = -1;
  }
  return lVar3;
}

Assistant:

virtual long Run()
	{

		const char* const glsl_cs =
			NL "layout(local_size_x = 8, local_size_y = 8, local_size_z = 1) in;" NL
			   "layout(binding = 0) uniform atomic_uint ac_counter[3];" NL "layout(std430) buffer Output {" NL
			   "  mediump uint data_inc[256];" NL "} g_out;" NL "void main() {" NL
			   "  mediump uint offset = 32u * gl_GlobalInvocationID.y + gl_GlobalInvocationID.x;" NL
			   "  g_out.data_inc[offset] = atomicCounterIncrement(ac_counter);" NL "}";

		prog_ = CreateComputeProgram(glsl_cs);
		glLinkProgram(prog_);
		if (CheckProgram(prog_))
		{
			Output("Link should fail because atomicCounterIncrement cannot be used on array of atomic counters.\n");
			return ERROR;
		}
		return NO_ERROR;
	}